

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda1.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long *plVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x: ",3);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,0);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"y: ",3);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x4d);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x: ",3);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,0);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"y: ",3);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x4e);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Finally y: ",0xb);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x4f);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	int x = 0;
	int y = 42;

	auto f = [x, &y] {
		cout << "x: " << x << endl;
		cout << "y: " << y << endl;
		++y;
	};

	// auto f = [x, &y]() mutable {
	// 	cout << "x: " << x << endl;
	// 	cout << "y: " << y << endl;
	// 	++x;
	// 	++y;
	// };

	x = y = 77;
	f();
	f();

	cout << "Finally y: " << y << endl;
	return 0;
}